

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_prepare.cpp
# Opt level: O2

void __thiscall mocker::CodegenPreparation::sortBlocks(CodegenPreparation *this)

{
  __node_base_ptr *pp_Var1;
  FunctionModule *pFVar2;
  pointer puVar3;
  bool bVar4;
  BasicBlock *pBVar5;
  BasicBlock *pBVar6;
  BasicBlockList *pBVar7;
  _List_node_base *p_Var8;
  iterator __begin1;
  pointer puVar9;
  iterator __end1;
  pointer puVar10;
  unsigned_long n;
  size_t nxt;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  BasicBlockList newBBs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> PreOrder;
  vector<unsigned_long,_std::allocator<unsigned_long>_> order;
  size_t local_70;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  visited;
  
  LoopInfo::init(&this->loopTree,(EVP_PKEY_CTX *)(this->super_FuncPass).func);
  pFVar2 = (this->super_FuncPass).func;
  PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp_Var1 = &visited._M_h._M_single_bucket;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  visited._M_h._M_buckets = pp_Var1;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  *order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = (unsigned_long)&PreOrder;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (unsigned_long)pFVar2;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = (unsigned_long)&visited;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[3] = (unsigned_long)&order;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp:25:42)>
                ::_M_manager;
  std::function<void_(unsigned_long)>::operator()
            ((function<void_(unsigned_long)> *)&order,
             (unsigned_long)
             (pFVar2->bbs).
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next[1]._M_next);
  std::_Function_base::~_Function_base((_Function_base *)&order);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&visited._M_h);
  puVar9 = PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  visited._M_h._M_bucket_count = 1;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count = 0;
  visited._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar10 = PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  visited._M_h._M_buckets = pp_Var1;
  do {
    puVar3 = order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar10 == puVar9) {
      if ((long)order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
          (long)PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
        __assert_fail("order.size() == PreOrder.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/codegen_prepare.cpp"
                      ,0x5e,"void mocker::CodegenPreparation::sortBlocks()");
      }
      newBBs.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
      _M_impl._M_node._M_size = 0;
      puVar9 = order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      newBBs.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&newBBs;
      newBBs.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&newBBs;
      do {
        if (puVar9 == puVar3) {
          std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
          _M_move_assign(&((this->super_FuncPass).func)->bbs,
                         &newBBs.
                          super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                        );
          std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
          ::_M_clear(&newBBs.
                      super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                    );
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&visited._M_h);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&PreOrder.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          return;
        }
        pBVar7 = &((this->super_FuncPass).func)->bbs;
        p_Var8 = (_List_node_base *)pBVar7;
        do {
          p_Var8 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                    &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var8 == (_List_node_base *)pBVar7) goto LAB_0015175b;
        } while (p_Var8[1]._M_next != (_List_node_base *)*puVar9);
        std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
        emplace_back<mocker::ir::BasicBlock_const&>
                  ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)&newBBs,
                   (BasicBlock *)(p_Var8 + 1));
LAB_0015175b:
        puVar9 = puVar9 + 1;
      } while( true );
    }
    n = *puVar10;
    bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                      (&visited,&n);
    if ((!bVar4) ||
       (order.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] == n)) {
      bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                        (&visited,&n);
      if (!bVar4) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&order,&n);
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<unsigned_long&>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&visited,&n);
      }
      pBVar5 = ir::FunctionModule::getBasicBlock((this->super_FuncPass).func,n);
      ir::dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&newBBs,
                 (shared_ptr<mocker::ir::IRInst> *)
                 ((pBVar5->insts).
                  super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1));
      if (newBBs.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
          _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
        bVar4 = LoopInfo::isLoopHeader(&this->loopTree,n);
        if (bVar4) {
          nxt = (size_t)(newBBs.
                         super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                         ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev)->_M_prev;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&order,&nxt);
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_long&>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&visited,&nxt);
        }
        else {
          pBVar5 = ir::FunctionModule::getBasicBlock
                             ((this->super_FuncPass).func,
                              (size_t)(newBBs.
                                       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                                       ._M_impl._M_node.super__List_node_base._M_next[2]._M_prev)->
                                      _M_prev);
          pBVar6 = ir::FunctionModule::getBasicBlock
                             ((this->super_FuncPass).func,
                              (size_t)(newBBs.
                                       super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                                       ._M_impl._M_node.super__List_node_base._M_next[3]._M_prev)->
                                      _M_prev);
          ir::dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>
                    ((ir *)&nxt,
                     (shared_ptr<mocker::ir::IRInst> *)
                     ((pBVar5->insts).
                      super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 1));
          if (nxt == 0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
          }
          else {
            local_70 = pBVar6->labelID;
            bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                              (&visited,&local_70);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8);
            if (!bVar4) {
              nxt = pBVar6->labelID;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(&order,&nxt);
              nxt = pBVar6->labelID;
              std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_emplace<unsigned_long>(&visited._M_h,&nxt);
              goto LAB_001516e8;
            }
          }
          nxt = pBVar5->labelID;
          bVar4 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                            (&visited,&nxt);
          if (!bVar4) {
            nxt = pBVar5->labelID;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&order,&nxt);
            nxt = pBVar5->labelID;
            std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_emplace<unsigned_long>(&visited._M_h,&nxt);
          }
        }
      }
LAB_001516e8:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &newBBs.
                  super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                  _M_impl._M_node.super__List_node_base._M_prev);
    }
    puVar10 = puVar10 + 1;
  } while( true );
}

Assistant:

void CodegenPreparation::sortBlocks() {
  loopTree.init(func);

  const auto PreOrder = getPreOrder(func);

  std::unordered_set<std::size_t> visited;
  std::vector<std::size_t> order;
  for (auto n : PreOrder) {
    if (isIn(visited, n) && order.back() != n) // can not be scheduled
      continue;

    if (!isIn(visited, n)) {
      order.emplace_back(n);
      visited.emplace(n);
    }

    auto br = ir::dyc<ir::Branch>(func.getBasicBlock(n).getInsts().back());
    if (!br) {
      continue;
    }

    if (loopTree.isLoopHeader(n)) {
      auto nxt = br->getThen()->getID();
      order.emplace_back(nxt);
      visited.emplace(nxt);
      continue;
    }

    auto &thenBB = func.getBasicBlock(br->getThen()->getID());
    auto &elseBB = func.getBasicBlock(br->getElse()->getID());
    if (ir::dyc<ir::Ret>(thenBB.getInsts().back()) &&
        !isIn(visited, elseBB.getLabelID())) {
      order.emplace_back(elseBB.getLabelID());
      visited.emplace(elseBB.getLabelID());
    } else if (!isIn(visited, thenBB.getLabelID())) {
      order.emplace_back(thenBB.getLabelID());
      visited.emplace(thenBB.getLabelID());
    }
  }

  assert(order.size() == PreOrder.size());

  ir::BasicBlockList newBBs;
  for (auto cur : order) {
    for (auto &bb : func.getBBs()) {
      if (bb.getLabelID() != cur)
        continue;
      newBBs.emplace_back(bb);
      break;
    }
  }
  func.getMutableBBs() = std::move(newBBs);
}